

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall xmrig::Buffer::Buffer(Buffer *this,Buffer *other)

{
  EVP_PKEY_CTX *dst;
  EVP_PKEY_CTX *src;
  Buffer *in_RSI;
  Buffer *in_RDI;
  
  in_RDI->m_data = (char *)0x0;
  in_RDI->m_size = 0;
  dst = (EVP_PKEY_CTX *)data(in_RSI);
  src = (EVP_PKEY_CTX *)size(in_RSI);
  copy(in_RDI,dst,src);
  return;
}

Assistant:

xmrig::Buffer::Buffer(const Buffer &other)
{
    copy(other.data(), other.size());
}